

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Jupiter::Socket::close(Socket *this,int __fd)

{
  Socket *this_local;
  
  if (this->m_data != (Data *)0x0) {
    if ((this->m_data->is_shutdown & 1U) == 0) {
      (*this->_vptr_Socket[4])();
    }
    ::close(this->m_data->rawSock);
    this = (Socket *)this->m_data;
    ((Data *)this)->rawSock = 0;
  }
  return (int)this;
}

Assistant:

void Jupiter::Socket::close() {
	if (m_data != nullptr) {
		if (m_data->is_shutdown == false)
			this->shutdown();
#if defined _WIN32
		::closesocket(m_data->rawSock);
#else // _WIN32
		::close(m_data->rawSock);
#endif // _WIN32
		m_data->rawSock = 0;
	}
}